

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O1

void __thiscall Fl_Graphics_Driver::circle(Fl_Graphics_Driver *this,double x,double y,double r)

{
  double dVar1;
  double dVar2;
  code *pcVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar8 = (this->m).a;
  dVar9 = (this->m).b;
  dVar10 = (this->m).c;
  dVar7 = (this->m).x;
  dVar1 = (this->m).d;
  dVar6 = (this->m).y;
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    dVar4 = dVar8 * dVar8 + dVar10 * dVar10;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
  }
  else {
    dVar4 = ABS(dVar8);
  }
  dVar2 = (this->m).b;
  dVar5 = (this->m).d;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    dVar5 = dVar2 * dVar2 + dVar5 * dVar5;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
  }
  else {
    dVar5 = ABS(dVar5);
  }
  dVar6 = dVar6 + dVar9 * x + dVar1 * y;
  dVar7 = dVar7 + dVar8 * x + dVar10 * y;
  dVar8 = rint(dVar7 - dVar4 * r);
  dVar9 = rint(dVar4 * r + dVar7);
  dVar10 = rint(dVar6 - dVar5 * r);
  dVar7 = rint(dVar5 * r + dVar6);
  if (this->what == 2) {
    pcVar3 = XFillArc;
  }
  else {
    pcVar3 = XDrawArc;
  }
  (*pcVar3)(fl_display,fl_window,fl_gc,(int)dVar8,(int)dVar10,(int)dVar9 - (int)dVar8,
            (int)dVar7 - (int)dVar10,0,0x5a00);
  return;
}

Assistant:

void Fl_Graphics_Driver::circle(double x, double y,double r) {
  double xt = transform_x(x,y);
  double yt = transform_y(x,y);
  double rx = r * (m.c ? sqrt(m.a*m.a+m.c*m.c) : fabs(m.a));
  double ry = r * (m.b ? sqrt(m.b*m.b+m.d*m.d) : fabs(m.d));
  int llx = (int)rint(xt-rx);
  int w = (int)rint(xt+rx)-llx;
  int lly = (int)rint(yt-ry);
  int h = (int)rint(yt+ry)-lly;

#if defined(USE_X11)
  (what == POLYGON ? XFillArc : XDrawArc)
    (fl_display, fl_window, fl_gc, llx, lly, w, h, 0, 360*64);
#elif defined(WIN32)
  if (what==POLYGON) {
    SelectObject(fl_gc, fl_brush());
    Pie(fl_gc, llx, lly, llx+w, lly+h, 0,0, 0,0); 
  } else
    Arc(fl_gc, llx, lly, llx+w, lly+h, 0,0, 0,0); 
#elif defined(__APPLE_QUARTZ__)
  // Quartz warning: circle won't scale to current matrix!
  // Last argument must be 0 (counter-clockwise) or it draws nothing under __LP64__ !!!!
  CGContextSetShouldAntialias(fl_gc, true);
  CGContextAddArc(fl_gc, xt, yt, (w+h)*0.25f, 0, 2.0f*M_PI, 0);
  (what == POLYGON ? CGContextFillPath : CGContextStrokePath)(fl_gc);
  CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}